

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::RecordAllStringTemplateCallsiteConstants
          (ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  FuncInfo *this_00;
  anon_class_8_1_3e9b088b_for_fn fn;
  FunctionBody *byteCodeFunction;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  this_00 = TopFuncInfo(this);
  fn.byteCodeFunction = FuncInfo::GetParsedFunctionBody(this_00);
  JsUtil::
  BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::Map<ByteCodeGenerator::RecordAllStringTemplateCallsiteConstants(FuncInfo*)::__0>
            ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&funcInfo->stringTemplateCallsiteRegisterMap,fn);
  return;
}

Assistant:

void ByteCodeGenerator::RecordAllStringTemplateCallsiteConstants(FuncInfo* funcInfo)
{
    Js::FunctionBody *byteCodeFunction = this->TopFuncInfo()->GetParsedFunctionBody();
    funcInfo->stringTemplateCallsiteRegisterMap.Map([byteCodeFunction](ParseNodePtr pnode, Js::RegSlot location)
    {
        Js::ScriptContext* scriptContext = byteCodeFunction->GetScriptContext();
        
        Js::RecyclableObject* rawArray = ByteCodeGenerator::BuildArrayFromStringList(pnode->AsParseNodeStrTemplate()->pnodeStringRawLiterals, pnode->AsParseNodeStrTemplate()->countStringLiterals, scriptContext);
        rawArray->Freeze();

        Js::RecyclableObject* callsiteObject = ByteCodeGenerator::BuildArrayFromStringList(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, pnode->AsParseNodeStrTemplate()->countStringLiterals, scriptContext);
        callsiteObject->SetPropertyWithAttributes(Js::PropertyIds::raw, rawArray, PropertyNone, nullptr);
        callsiteObject->Freeze();

        byteCodeFunction->RecordConstant(byteCodeFunction->MapRegSlot(location), callsiteObject);
    });
}